

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

FFSContext create_FFSContext_FM(FMContext_conflict fmc)

{
  FFSContext p_Var1;
  FMContext in_RDI;
  FFSContext c;
  size_t in_stack_fffffffffffffff0;
  FMContext local_8;
  
  p_Var1 = (FFSContext)ffs_malloc(in_stack_fffffffffffffff0);
  init_float_formats();
  if (in_RDI == (FMContext)0x0) {
    local_8 = create_FMcontext();
  }
  else {
    add_ref_FMcontext(in_RDI);
    local_8 = in_RDI;
  }
  p_Var1->fmc = local_8;
  p_Var1->handle_list_size = 0;
  p_Var1->handle_list = (FFSTypeHandle_conflict *)0x0;
  (p_Var1->tmp).tmp_buffer = (void *)0x0;
  (p_Var1->tmp).tmp_buffer_size = 0;
  (p_Var1->tmp).tmp_buffer_in_use_size = 0;
  return p_Var1;
}

Assistant:

extern
FFSContext
create_FFSContext_FM(FMContext fmc)
{
    FFSContext c;
    c = (FFSContext) malloc((size_t) sizeof(*c));
    init_float_formats();
    if (fmc == NULL) {
        fmc = create_FMcontext();
    } else {
        add_ref_FMcontext(fmc);
    }
    c->fmc = fmc;
    c->handle_list_size = 0;
    c->handle_list = NULL;
    c->tmp.tmp_buffer = NULL;
    c->tmp.tmp_buffer_size = 0;
    c->tmp.tmp_buffer_in_use_size = 0;

    return c;
}